

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

void GenerateDitherQ7Lb(int16_t *bufQ7,uint32_t seed,int length,int16_t AvgPitchGain_Q12)

{
  short sVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int16_t dither_gain_Q14;
  int16_t dither2_Q7;
  int16_t dither1_Q7;
  int shft;
  int k;
  uint32_t uStack_14;
  int16_t AvgPitchGain_Q12_local;
  int length_local;
  uint32_t seed_local;
  int16_t *bufQ7_local;
  
  uStack_14 = seed;
  if (AvgPitchGain_Q12 < 0x266) {
    for (_dither2_Q7 = 0; _dither2_Q7 < length + -2; _dither2_Q7 = _dither2_Q7 + 3) {
      sVar1 = (short)((int)(uStack_14 * 0xbb38435 + 0x3719636b) >> 0x19);
      iVar3 = (uStack_14 * 0xbb38435 + 0x3619636b) * 0xbb38435;
      uStack_14 = iVar3 + 0x3619636b;
      sVar2 = (short)(iVar3 + 0x3719636b >> 0x19);
      uVar4 = uStack_14 >> 0x19 & 0xf;
      if (uVar4 < 5) {
        bufQ7[_dither2_Q7] = sVar1;
        bufQ7[_dither2_Q7 + 1] = sVar2;
        bufQ7[_dither2_Q7 + 2] = 0;
      }
      else if (uVar4 < 10) {
        bufQ7[_dither2_Q7] = sVar1;
        bufQ7[_dither2_Q7 + 1] = 0;
        bufQ7[_dither2_Q7 + 2] = sVar2;
      }
      else {
        bufQ7[_dither2_Q7] = 0;
        bufQ7[_dither2_Q7 + 1] = sVar1;
        bufQ7[_dither2_Q7 + 2] = sVar2;
      }
    }
  }
  else {
    for (_dither2_Q7 = 0; _dither2_Q7 < length + -1; _dither2_Q7 = _dither2_Q7 + 2) {
      iVar3 = uStack_14 * 0xbb38435;
      uStack_14 = iVar3 + 0x3619636b;
      uVar4 = uStack_14 >> 0x19 & 1;
      bufQ7[(int)(_dither2_Q7 + uVar4)] =
           (int16_t)((int)(short)(AvgPitchGain_Q12 * -10 + 0x5800) *
                     (int)(short)(iVar3 + 0x3719636b >> 0x19) + 0x2000 >> 0xe);
      bufQ7[(int)((_dither2_Q7 + 1) - uVar4)] = 0;
    }
  }
  return;
}

Assistant:

static void GenerateDitherQ7Lb(int16_t* bufQ7, uint32_t seed,
                               int length, int16_t AvgPitchGain_Q12) {
  int   k, shft;
  int16_t dither1_Q7, dither2_Q7, dither_gain_Q14;

  /* This threshold should be equal to that in decode_spec(). */
  if (AvgPitchGain_Q12 < 614) {
    for (k = 0; k < length - 2; k += 3) {
      /* New random unsigned int. */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64 (Q7). */
      /* dither = seed * 128 / 4294967295 */
      dither1_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      /* New random unsigned int. */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64. */
      dither2_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      shft = (seed >> 25) & 15;
      if (shft < 5) {
        bufQ7[k]   = dither1_Q7;
        bufQ7[k + 1] = dither2_Q7;
        bufQ7[k + 2] = 0;
      } else if (shft < 10) {
        bufQ7[k]   = dither1_Q7;
        bufQ7[k + 1] = 0;
        bufQ7[k + 2] = dither2_Q7;
      } else {
        bufQ7[k]   = 0;
        bufQ7[k + 1] = dither1_Q7;
        bufQ7[k + 2] = dither2_Q7;
      }
    }
  } else {
    dither_gain_Q14 = (int16_t)(22528 - 10 * AvgPitchGain_Q12);

    /* Dither on half of the coefficients. */
    for (k = 0; k < length - 1; k += 2) {
      /* New random unsigned int */
      seed = (seed * 196314165) + 907633515;

      /* Fixed-point dither sample between -64 and 64. */
      dither1_Q7 = (int16_t)(((int32_t)(seed + 16777216)) >> 25);

      /* Dither sample is placed in either even or odd index. */
      shft = (seed >> 25) & 1;     /* Either 0 or 1 */

      bufQ7[k + shft] = (((dither_gain_Q14 * dither1_Q7) + 8192) >> 14);
      bufQ7[k + 1 - shft] = 0;
    }
  }
}